

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::CanDeadStoreInstrForScopeObjRemoval(BackwardPass *this,Sym *sym)

{
  OpCode OVar1;
  Func *func;
  bool bVar2;
  byte bVar3;
  BackwardPass *this_00;
  HelperCallOpnd *pHVar4;
  StackSym *pSVar5;
  Instr *pIVar6;
  RegOpnd *this_01;
  Opnd *this_02;
  
  if (this->tag == DeadStorePhase) {
    bVar2 = Func::IsStackArgsEnabled(this->currentInstr->m_func);
    if (bVar2) {
      func = this->currentInstr->m_func;
      this_00 = (BackwardPass *)JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      bVar2 = JITTimeFunctionBody::GetDoScopeObjectCreation((JITTimeFunctionBody *)this_00);
      pHVar4 = (HelperCallOpnd *)(ulong)bVar2;
      pIVar6 = this->currentInstr;
      OVar1 = pIVar6->m_opcode;
      if (OVar1 < InitCachedScope) {
        if (1 < OVar1 - 0xdb) {
          if ((OVar1 == LdSlot) && (sym != (Sym *)0x0)) {
            bVar2 = IsFormalParamSym(this_00,func,sym);
LAB_003e2509:
            pHVar4 = (HelperCallOpnd *)(ulong)bVar2;
            if (bVar2 != false) {
              bVar3 = true;
              goto LAB_003e251d;
            }
          }
          goto LAB_003e2551;
        }
        if (!bVar2) {
          this_02 = pIVar6->m_src1;
          goto LAB_003e2515;
        }
LAB_003e24ea:
        bVar2 = false;
        bVar3 = 0;
      }
      else if (OVar1 - 0x282 < 2) {
        if (bVar2) goto LAB_003e24ea;
        this_02 = pIVar6->m_src2;
LAB_003e2515:
        bVar3 = IR::Opnd::IsScopeObjOpnd(this_02,func);
LAB_003e251d:
        bVar2 = false;
      }
      else {
        if (OVar1 == CallHelper) {
          if (!bVar2) {
            pHVar4 = IR::Opnd::AsHelperCallOpnd(pIVar6->m_src1);
            if (pHVar4->m_fnHelper == HelperOP_InitCachedFuncs) {
              pSVar5 = IR::Opnd::GetStackSym(this->currentInstr->m_src2);
              bVar2 = false;
              if ((pSVar5->field_0x18 & 1) == 0) {
                pIVar6 = (Instr *)0x0;
              }
              else {
                pIVar6 = (pSVar5->field_5).m_instrDef;
              }
              this_01 = IR::Opnd::AsRegOpnd(pIVar6->m_src1);
              bVar3 = IR::Opnd::IsScopeObjOpnd(&this_01->super_Opnd,func);
              goto LAB_003e2554;
            }
          }
        }
        else if ((OVar1 == InitCachedScope) && (!bVar2)) {
          bVar2 = IR::Opnd::IsScopeObjOpnd(pIVar6->m_dst,func);
          goto LAB_003e2509;
        }
LAB_003e2551:
        bVar3 = (byte)pHVar4;
        bVar2 = true;
      }
LAB_003e2554:
      if (!bVar2) goto LAB_003e255b;
    }
  }
  bVar3 = 0;
LAB_003e255b:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
BackwardPass::CanDeadStoreInstrForScopeObjRemoval(Sym *sym) const
{
    if (tag == Js::DeadStorePhase && this->currentInstr->m_func->IsStackArgsEnabled())
    {
        Func * currFunc = this->currentInstr->m_func;
        bool doScopeObjCreation = currFunc->GetJITFunctionBody()->GetDoScopeObjectCreation();
        switch (this->currentInstr->m_opcode)
        {
            case Js::OpCode::InitCachedScope:
            {
                if(!doScopeObjCreation && this->currentInstr->GetDst()->IsScopeObjOpnd(currFunc))
                {
                    /*
                    *   We don't really dead store this instruction. We just want the source sym of this instruction
                    *   to NOT be tracked as USED by this instruction.
                    *   This instr will effectively be lowered to dest = MOV NULLObject, in the lowerer phase.
                    */
                    return true;
                }
                break;
            }
            case Js::OpCode::LdSlot:
            {
                if (sym && IsFormalParamSym(currFunc, sym))
                {
                    return true;
                }
                break;
            }
            case Js::OpCode::CommitScope:
            case Js::OpCode::GetCachedFunc:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc1()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc2()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::CallHelper:
            {
                if (!doScopeObjCreation && this->currentInstr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = this->currentInstr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    return scopeObjOpnd->IsScopeObjOpnd(currFunc);
                }
                break;
            }
        }
    }
    return false;
}